

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::detachClausePurgatory(Solver *this,CRef cr,bool strict)

{
  uint *puVar1;
  undefined7 in_register_00000011;
  Lit local_c;
  Watcher local_8;
  
  puVar1 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  if ((int)CONCAT71(in_register_00000011,strict) == 0) {
    local_c.x = puVar1[(ulong)cr + 3] ^ 1;
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::smudge(&this->unaryWatches,&local_c);
  }
  else {
    local_8.blocker.x = puVar1[(ulong)cr + 4];
    local_8.cref = cr;
    remove<Glucose::vec<Glucose::Solver::Watcher>,Glucose::Solver::Watcher>
              ((this->unaryWatches).occs.data + ((long)(int)puVar1[(ulong)cr + 3] ^ 1),&local_8);
  }
  return;
}

Assistant:

void Solver::detachClausePurgatory(CRef cr, bool strict) {
    const Clause &c = ca[cr];

    assert(c.size() > 1);
    if(strict)
        remove(unaryWatches[~c[0]], Watcher(cr, c[1]));
    else
        unaryWatches.smudge(~c[0]);
}